

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QStyle * __thiscall QFormLayoutPrivate::getStyle(QFormLayoutPrivate *this)

{
  QWidget *pQVar1;
  QFormLayoutPrivate *in_RDI;
  QWidget *parentWidget;
  QFormLayout *q;
  QWidget *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  q_func(in_RDI);
  pQVar1 = QLayout::parentWidget((QLayout *)in_RDI);
  if (pQVar1 == (QWidget *)0x0) {
    local_8 = QApplication::style();
  }
  else {
    local_8 = QWidget::style(in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

QStyle* QFormLayoutPrivate::getStyle() const
{
    Q_Q(const QFormLayout);

    // ### cache
    if (QWidget *parentWidget = q->parentWidget())
        return parentWidget->style();
    else
        return QApplication::style();
}